

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O2

singlecomplex * singlecomplexCalloc(size_t n)

{
  singlecomplex *psVar1;
  size_t sVar2;
  char msg [256];
  char acStack_118 [256];
  
  psVar1 = (singlecomplex *)superlu_malloc(n * 8);
  if (psVar1 == (singlecomplex *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit(acStack_118);
  }
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    psVar1[sVar2].r = 0.0;
    psVar1[sVar2].i = 0.0;
  }
  return psVar1;
}

Assistant:

singlecomplex *singlecomplexCalloc(size_t n)
{
    singlecomplex *buf;
    register size_t i;
    singlecomplex zero = {0.0, 0.0};
    buf = (singlecomplex *) SUPERLU_MALLOC(n * (size_t) sizeof(singlecomplex));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}